

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceVisitor.hpp
# Opt level: O1

void __thiscall
netlist::InstanceVisitor::handleInstanceExtPorts(InstanceVisitor *this,InstanceSymbol *symbol)

{
  pointer ppPVar1;
  ArgumentDirection direction;
  PortConnection *this_00;
  pointer ppNVar2;
  pointer ppPVar3;
  RootSymbol *pRVar4;
  Expression *pEVar5;
  NetlistNode *node;
  pointer ppNVar6;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> sVar7;
  VariableReferenceVisitor visitor;
  VariableReferenceVisitor local_3c8;
  EvalContext local_380;
  
  sVar7 = slang::ast::InstanceSymbol::getPortConnections(symbol);
  ppPVar3 = sVar7._M_ptr;
  if (sVar7._M_extent._M_extent_value._M_extent_value != 0) {
    ppPVar1 = ppPVar3 + sVar7._M_extent._M_extent_value._M_extent_value;
    do {
      this_00 = *ppPVar3;
      if (this_00->port->kind == Port) {
        direction = *(ArgumentDirection *)&this_00->port[1].name._M_str;
        pRVar4 = slang::ast::Compilation::getRoot(this->compilation);
        local_380.astCtx.scope.ptr = &pRVar4->super_Scope;
        local_380.astCtx.instanceOrProc = (Symbol *)0x0;
        local_380.astCtx.firstTempVar = (TempVarSymbol *)0x0;
        local_380.astCtx.randomizeDetails = (RandomizeDetails *)0x0;
        local_380.astCtx.assertionInstance = (AssertionInstanceDetails *)0x0;
        local_380.astCtx.lookupIndex = 0xffffffff;
        local_380.astCtx.flags.m_bits = 0;
        local_380.flags.m_bits = '\0';
        local_380._60_8_ = 0;
        local_380._68_8_ = 0;
        local_380.queueTarget._4_4_ = 0;
        local_380.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
             (pointer)local_380.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                      firstElement;
        local_380.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
        node = (NetlistNode *)0x2;
        local_380.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
        local_380.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
        local_380.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
        local_380.diags.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.data_ =
             (pointer)local_380.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                      super_SmallVectorBase<slang::Diagnostic>.firstElement;
        local_380.diags.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.len = 0;
        local_380.diags.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.cap = 2;
        local_380.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.data_ =
             (pointer)local_380.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                      super_SmallVectorBase<slang::Diagnostic>.firstElement;
        local_380.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.len = 0;
        local_380.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.cap = 2;
        local_380.disableRange.startLoc = (SourceLocation)0x0;
        local_380.disableRange.endLoc = (SourceLocation)0x0;
        local_380.backtraceReported = false;
        local_380.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
             (pointer)local_380.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
        pEVar5 = slang::ast::PortConnection::getExpression(this_00);
        if (pEVar5 != (Expression *)0x0) {
          local_3c8.leftOperand = (direction & ~InOut) == In;
          local_3c8.netlist = this->netlist;
          local_3c8.evalCtx = &local_380;
          local_3c8.selectors.
          super__Vector_base<const_slang::ast::Expression_*,_std::allocator<const_slang::ast::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3c8.selectors.
          super__Vector_base<const_slang::ast::Expression_*,_std::allocator<const_slang::ast::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_3c8.varList.
          super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_3c8.selectors.
          super__Vector_base<const_slang::ast::Expression_*,_std::allocator<const_slang::ast::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_3c8.varList.
          super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_3c8.varList.
          super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          node = (NetlistNode *)slang::ast::PortConnection::getExpression(this_00);
          slang::ast::Expression::
          visitExpression<slang::ast::Expression_const,netlist::VariableReferenceVisitor&>
                    ((Expression *)node,(Expression *)node,&local_3c8);
          ppNVar2 = local_3c8.varList.
                    super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppNVar6 = local_3c8.varList.
                         super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppNVar6 != ppNVar2;
              ppNVar6 = ppNVar6 + 1) {
            node = *ppNVar6;
            connectPortExternal(this,node,this_00->port,direction);
          }
          if (local_3c8.selectors.
              super__Vector_base<const_slang::ast::Expression_*,_std::allocator<const_slang::ast::Expression_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            node = (NetlistNode *)
                   ((long)local_3c8.selectors.
                          super__Vector_base<const_slang::ast::Expression_*,_std::allocator<const_slang::ast::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                   (long)local_3c8.selectors.
                         super__Vector_base<const_slang::ast::Expression_*,_std::allocator<const_slang::ast::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            operator_delete(local_3c8.selectors.
                            super__Vector_base<const_slang::ast::Expression_*,_std::allocator<const_slang::ast::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,(size_t)node);
          }
          if (local_3c8.varList.
              super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            node = (NetlistNode *)
                   ((long)local_3c8.varList.
                          super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                   (long)local_3c8.varList.
                         super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            operator_delete(local_3c8.varList.
                            super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,(size_t)node);
          }
        }
        slang::SmallVectorBase<slang::Diagnostic>::cleanup
                  ((SmallVectorBase<slang::Diagnostic> *)&local_380.warnings,(EVP_PKEY_CTX *)node);
        slang::SmallVectorBase<slang::Diagnostic>::cleanup
                  ((SmallVectorBase<slang::Diagnostic> *)&local_380.diags,(EVP_PKEY_CTX *)node);
        if (local_380.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ !=
            (pointer)local_380.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement) {
          operator_delete(local_380.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_);
        }
        slang::SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
                  (&local_380.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>,
                   (EVP_PKEY_CTX *)node);
      }
      ppPVar3 = ppPVar3 + 1;
    } while (ppPVar3 != ppPVar1);
  }
  return;
}

Assistant:

auto handleInstanceExtPorts(ast::InstanceSymbol const& symbol) {

        for (auto* portConnection : symbol.getPortConnections()) {

            if (portConnection->port.kind == ast::SymbolKind::Port) {
                auto& port = portConnection->port.as<ast::PortSymbol>();
                auto direction = portConnection->port.as<ast::PortSymbol>().direction;

                ast::EvalContext evalCtx(
                    ast::ASTContext(compilation.getRoot(), ast::LookupLocation::max));

                // The port is the target of an assignment if it is an input.
                bool isLeftOperand = direction == ast::ArgumentDirection::In ||
                                     direction == ast::ArgumentDirection::InOut;

                if (portConnection->getExpression() == nullptr) {
                    // Empty port hookup so skip.
                    continue;
                }

                // Collect variable references in the port expression.
                VariableReferenceVisitor visitor(netlist, evalCtx, isLeftOperand);
                portConnection->getExpression()->visit(visitor);

                for (auto* node : visitor.getVars()) {
                    connectPortExternal(node, portConnection->port, direction);
                }
            }
            else if (portConnection->port.kind == ast::SymbolKind::InterfacePort) {
                // Skip
            }
            else {
                SLANG_UNREACHABLE;
            }
        }
    }